

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

void P_ReadDemoWeaponsChunk(BYTE **demo)

{
  uint size;
  int iVar1;
  undefined8 in_RAX;
  Node *pNVar2;
  char *text;
  PClass *p;
  PClassWeapon *key;
  ulong uVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  size = ReadWord(demo);
  if (Weapons_ntoh.Count <= size && size - Weapons_ntoh.Count != 0) {
    TArray<PClassWeapon_*,_PClassWeapon_*>::Grow(&Weapons_ntoh,size - Weapons_ntoh.Count);
  }
  Weapons_ntoh.Count = size;
  M_Free(Weapons_hton.Nodes);
  Weapons_hton.Size = 0;
  Weapons_hton.NumUsed = 0;
  Weapons_hton.Nodes = (Node *)0x0;
  Weapons_hton.LastFree = (Node *)0x0;
  TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::SetNodeVector
            (&Weapons_hton,size);
  *Weapons_ntoh.Array = (PClassWeapon *)0x0;
  pNVar2 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::GetNode
                     (&Weapons_hton,(PClassWeapon *)0x0);
  (pNVar2->Pair).Value = 0;
  if (1 < (int)size) {
    uVar3 = 1;
    do {
      text = ReadStringConst(demo);
      iVar1 = FName::NameManager::FindName(&FName::NameData,text,true);
      uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      p = PClass::FindClass((FName *)((long)&uStack_38 + 4));
      key = dyn_cast<PClassWeapon>((DObject *)p);
      Weapons_ntoh.Array[uVar3] = key;
      if (key != (PClassWeapon *)0x0) {
        pNVar2 = TMap<PClassWeapon_*,_int,_THashTraits<PClassWeapon_*>,_TValueTraits<int>_>::GetNode
                           (&Weapons_hton,key);
        (pNVar2->Pair).Value = (int)uVar3;
      }
      uVar3 = uVar3 + 1;
    } while (size != uVar3);
  }
  return;
}

Assistant:

void P_ReadDemoWeaponsChunk(BYTE **demo)
{
	int count, i;
	PClassWeapon *type;
	const char *s;

	count = ReadWord(demo);
	Weapons_ntoh.Resize(count);
	Weapons_hton.Clear(count);

	Weapons_ntoh[0] = type = NULL;
	Weapons_hton[type] = 0;

	for (i = 1; i < count; ++i)
	{
		s = ReadStringConst(demo);
		type = dyn_cast<PClassWeapon>(PClass::FindClass(s));
		// If a demo was recorded with a weapon that is no longer present,
		// should we report it?
		Weapons_ntoh[i] = type;
		if (type != NULL)
		{
			Weapons_hton[type] = i;
		}
	}
}